

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O0

RayDifferential * __thiscall
pbrt::SurfaceInteraction::SpawnRay
          (SurfaceInteraction *this,RayDifferential *rayi,BSDF *bsdf,Vector3f *wi,BxDFFlags flags)

{
  float fVar1;
  undefined1 auVar2 [16];
  BxDFFlags BVar3;
  BxDFFlags BVar4;
  float *in_RCX;
  long in_RDX;
  long in_RSI;
  RayDifferential *in_RDI;
  BxDFFlags in_R9D;
  type tVar5;
  type tVar6;
  type tVar7;
  type tVar8;
  type tVar9;
  float fVar10;
  undefined1 auVar57 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  Normal3<float> NVar58;
  Vector3<float> VVar59;
  Point3f PVar60;
  Point3<float> PVar61;
  Float dmudy;
  Float dmudx;
  Float mu;
  Float dDNdy_1;
  Float dDNdx_1;
  Float eta;
  Float dDNdy;
  Float dDNdx;
  Vector3f dwody;
  Vector3f dwodx;
  Normal3f dndy;
  Normal3f dndx;
  Normal3f ns;
  RayDifferential *rd;
  Normal3<float> *in_stack_fffffffffffff8d8;
  undefined7 in_stack_fffffffffffff8e0;
  undefined1 in_stack_fffffffffffff8e7;
  bool bVar62;
  undefined4 in_stack_fffffffffffff8e8;
  float in_stack_fffffffffffff8ec;
  undefined4 in_stack_fffffffffffff8f0;
  float fVar63;
  undefined4 in_stack_fffffffffffff8f4;
  undefined4 in_stack_fffffffffffff8f8;
  undefined4 in_stack_fffffffffffff8fc;
  float fVar64;
  undefined8 in_stack_fffffffffffff900;
  float s;
  undefined4 in_stack_fffffffffffff920;
  undefined4 in_stack_fffffffffffff924;
  float fVar65;
  Interaction *in_stack_fffffffffffff928;
  Vector3<float> local_608;
  Vector3<float> local_5fc;
  undefined8 local_5f0;
  float local_5e8;
  undefined8 local_5e0;
  float local_5d8;
  undefined8 local_5d0;
  float local_5c8;
  undefined8 local_5c0;
  float local_5b8;
  undefined8 local_5b0;
  float local_5a8;
  undefined8 local_5a0;
  float local_598;
  undefined8 local_590;
  float local_588;
  undefined8 local_578;
  float local_570;
  undefined8 local_568;
  float local_560;
  undefined8 local_558;
  float local_550;
  undefined8 local_548;
  float local_540;
  undefined8 local_53c;
  float local_534;
  undefined8 local_530;
  float local_528;
  undefined8 local_520;
  float local_518;
  undefined8 local_510;
  float local_508;
  undefined8 local_500;
  float local_4f8;
  undefined8 local_4f0;
  float local_4e8;
  undefined8 local_4e0;
  float local_4d8;
  undefined8 local_4d0;
  float local_4c8;
  undefined8 local_4b8;
  float local_4b0;
  undefined8 local_4a8;
  float local_4a0;
  undefined8 local_498;
  float local_490;
  undefined8 local_488;
  float local_480;
  undefined8 local_478;
  float local_470;
  float local_46c;
  float local_468;
  undefined4 local_464;
  float local_460;
  float local_45c;
  undefined8 local_458;
  float local_450;
  undefined8 local_444;
  float local_43c;
  undefined8 local_438;
  float local_430;
  undefined8 local_428;
  float local_420;
  undefined8 local_418;
  float local_410;
  undefined8 local_408;
  float local_400;
  float local_3fc;
  undefined8 local_3f8;
  float local_3f0;
  undefined8 local_3e8;
  float local_3e0;
  undefined8 local_3d8;
  float local_3d0;
  undefined8 local_3cc;
  float local_3c4;
  undefined8 local_3c0;
  float local_3b8;
  undefined8 local_3b0;
  float local_3a8;
  undefined8 local_3a0;
  float local_398;
  undefined8 local_390;
  float local_388;
  undefined8 local_380;
  float local_378;
  undefined8 local_370;
  float local_368;
  undefined8 local_360;
  float local_358;
  undefined8 local_350;
  float local_348;
  undefined8 local_340;
  float local_338;
  undefined8 local_330;
  float local_328;
  undefined8 local_320;
  float local_318;
  undefined8 local_310;
  float local_308;
  undefined8 local_2f8;
  float local_2f0;
  undefined8 local_2e8;
  float local_2e0;
  undefined8 local_2d8;
  float local_2d0;
  undefined8 local_2cc;
  float local_2c4;
  undefined8 local_2c0;
  float local_2b8;
  undefined8 local_2b0;
  float local_2a8;
  undefined8 local_2a0;
  float local_298;
  undefined8 local_290;
  float local_288;
  undefined8 local_280;
  float local_278;
  undefined8 local_270;
  float local_268;
  undefined8 local_260;
  float local_258;
  undefined8 local_250;
  float local_248;
  undefined8 local_238;
  float local_230;
  undefined8 local_228;
  float local_220;
  undefined8 local_218;
  float local_210;
  undefined8 local_208;
  float local_200;
  float local_1f8;
  float local_1f4;
  undefined8 local_1f0;
  float local_1e8;
  undefined8 local_1e0;
  float local_1d8;
  undefined8 local_1d0;
  float local_1c8;
  undefined8 local_1c0;
  float local_1b8;
  undefined8 local_1b0;
  float local_1a8;
  undefined8 local_1a0;
  float local_198;
  undefined8 local_190;
  float local_188;
  undefined8 local_180;
  float local_178;
  undefined8 local_170;
  float local_168;
  undefined8 local_160;
  float local_158;
  undefined8 local_150;
  float local_148;
  undefined8 local_144;
  float local_13c;
  undefined8 local_138;
  float local_130;
  undefined8 local_128;
  float local_120;
  undefined8 local_118;
  float local_110;
  undefined8 local_108;
  float local_100;
  undefined8 local_f8;
  float local_f0;
  undefined8 local_e8;
  float local_e0;
  undefined8 local_d8;
  float local_d0;
  undefined8 local_c8;
  float local_c0;
  undefined8 local_b8;
  float local_b0;
  undefined8 local_a8;
  float local_a0;
  undefined8 local_98;
  float local_90;
  undefined8 local_88;
  float local_80;
  undefined8 local_78;
  float local_70;
  undefined8 local_68;
  float local_60;
  undefined8 local_58;
  float local_50;
  undefined8 local_48;
  float local_40;
  undefined8 local_38;
  float local_30;
  BxDFFlags local_2c;
  float *local_20;
  long local_18;
  undefined1 extraout_var [60];
  
  fVar10 = (float)((ulong)in_stack_fffffffffffff900 >> 0x20);
  local_2c = in_R9D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  Interaction::SpawnRay
            (in_stack_fffffffffffff928,
             (Vector3f *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
  if ((*(byte *)(local_18 + 0x28) & 1) != 0) {
    local_30 = *(float *)(in_RSI + 0x88);
    local_38 = *(undefined8 *)(in_RSI + 0x80);
    auVar57 = (undefined1  [56])0x0;
    NVar58 = Tuple3<pbrt::Normal3,float>::operator*
                       ((Tuple3<pbrt::Normal3,_float> *)
                        CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                        in_stack_fffffffffffff8ec);
    local_60 = NVar58.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar11._0_8_ = NVar58.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar11._8_56_ = auVar57;
    local_68 = vmovlpd_avx(auVar11._0_16_);
    auVar57 = (undefined1  [56])0x0;
    local_58 = local_68;
    local_50 = local_60;
    NVar58 = Tuple3<pbrt::Normal3,float>::operator*
                       ((Tuple3<pbrt::Normal3,_float> *)
                        CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                        in_stack_fffffffffffff8ec);
    local_80 = NVar58.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar12._0_8_ = NVar58.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar12._8_56_ = auVar57;
    local_88 = vmovlpd_avx(auVar12._0_16_);
    local_78 = local_88;
    local_70 = local_80;
    NVar58 = Tuple3<pbrt::Normal3,float>::operator+
                       ((Tuple3<pbrt::Normal3,_float> *)
                        CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                        (Normal3<float> *)
                        CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
    local_90 = NVar58.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar13._0_8_ = NVar58.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar13._8_56_ = auVar57;
    local_98 = vmovlpd_avx(auVar13._0_16_);
    auVar57 = (undefined1  [56])0x0;
    local_48 = local_98;
    local_40 = local_90;
    NVar58 = Tuple3<pbrt::Normal3,float>::operator*
                       ((Tuple3<pbrt::Normal3,_float> *)
                        CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                        in_stack_fffffffffffff8ec);
    local_c0 = NVar58.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar14._0_8_ = NVar58.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar14._8_56_ = auVar57;
    local_c8 = vmovlpd_avx(auVar14._0_16_);
    auVar57 = (undefined1  [56])0x0;
    local_b8 = local_c8;
    local_b0 = local_c0;
    NVar58 = Tuple3<pbrt::Normal3,float>::operator*
                       ((Tuple3<pbrt::Normal3,_float> *)
                        CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                        in_stack_fffffffffffff8ec);
    local_e0 = NVar58.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar15._0_8_ = NVar58.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar15._8_56_ = auVar57;
    local_e8 = vmovlpd_avx(auVar15._0_16_);
    local_d8 = local_e8;
    local_d0 = local_e0;
    NVar58 = Tuple3<pbrt::Normal3,float>::operator+
                       ((Tuple3<pbrt::Normal3,_float> *)
                        CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                        (Normal3<float> *)
                        CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
    local_f0 = NVar58.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar16._0_8_ = NVar58.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar16._8_56_ = auVar57;
    local_f8 = vmovlpd_avx(auVar16._0_16_);
    local_a8 = local_f8;
    local_a0 = local_f0;
    VVar59 = Tuple3<pbrt::Vector3,_float>::operator-
                       ((Tuple3<pbrt::Vector3,_float> *)
                        CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0));
    local_120 = VVar59.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar17._0_8_ = VVar59.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar17._8_56_ = auVar57;
    local_128 = vmovlpd_avx(auVar17._0_16_);
    local_118 = local_128;
    local_110 = local_120;
    VVar59 = Tuple3<pbrt::Vector3,float>::operator-
                       ((Tuple3<pbrt::Vector3,_float> *)
                        CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                        (Vector3<float> *)
                        CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
    local_130 = VVar59.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar18._0_8_ = VVar59.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar18._8_56_ = auVar57;
    local_138 = vmovlpd_avx(auVar18._0_16_);
    local_108 = local_138;
    local_100 = local_130;
    VVar59 = Tuple3<pbrt::Vector3,_float>::operator-
                       ((Tuple3<pbrt::Vector3,_float> *)
                        CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0));
    local_158 = VVar59.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar19._0_8_ = VVar59.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar19._8_56_ = auVar57;
    local_160 = vmovlpd_avx(auVar19._0_16_);
    local_150 = local_160;
    local_148 = local_158;
    VVar59 = Tuple3<pbrt::Vector3,float>::operator-
                       ((Tuple3<pbrt::Vector3,_float> *)
                        CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                        (Vector3<float> *)
                        CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
    BVar4 = local_2c;
    local_168 = VVar59.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar20._0_8_ = VVar59.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar20._8_56_ = auVar57;
    local_170 = vmovlpd_avx(auVar20._0_16_);
    local_144 = local_170;
    local_13c = local_168;
    BVar3 = operator|(Reflection,Specular);
    if (BVar4 == BVar3) {
      in_RDI->hasDifferentials = true;
      PVar60 = Interaction::p((Interaction *)
                              CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0));
      local_198 = PVar60.super_Tuple3<pbrt::Point3,_float>.z;
      auVar21._0_8_ = PVar60.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar21._8_56_ = auVar57;
      local_1a0 = vmovlpd_avx(auVar21._0_16_);
      local_190 = local_1a0;
      local_188 = local_198;
      PVar61 = Point3<float>::operator+
                         ((Point3<float> *)
                          CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                          (Vector3<float> *)
                          CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
      local_1a8 = PVar61.super_Tuple3<pbrt::Point3,_float>.z;
      auVar22._0_8_ = PVar61.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar22._8_56_ = auVar57;
      local_1b0 = vmovlpd_avx(auVar22._0_16_);
      (in_RDI->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z = local_1a8;
      (in_RDI->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)local_1b0;
      (in_RDI->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)local_1b0 >> 0x20);
      local_180 = local_1b0;
      local_178 = local_1a8;
      PVar60 = Interaction::p((Interaction *)
                              CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0));
      local_1d8 = PVar60.super_Tuple3<pbrt::Point3,_float>.z;
      auVar23._0_8_ = PVar60.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar23._8_56_ = auVar57;
      local_1e0 = vmovlpd_avx(auVar23._0_16_);
      local_1d0 = local_1e0;
      local_1c8 = local_1d8;
      PVar61 = Point3<float>::operator+
                         ((Point3<float> *)
                          CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                          (Vector3<float> *)
                          CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
      local_1e8 = PVar61.super_Tuple3<pbrt::Point3,_float>.z;
      auVar24._0_8_ = PVar61.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar24._8_56_ = auVar57;
      local_1f0 = vmovlpd_avx(auVar24._0_16_);
      (in_RDI->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z = local_1e8;
      (in_RDI->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)local_1f0;
      (in_RDI->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)local_1f0 >> 0x20);
      local_1c0 = local_1f0;
      local_1b8 = local_1e8;
      tVar5 = Dot<float>((Vector3<float> *)
                         CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                         in_stack_fffffffffffff8d8);
      tVar6 = Dot<float>((Vector3<float> *)
                         CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                         in_stack_fffffffffffff8d8);
      local_1f4 = tVar5 + tVar6;
      tVar5 = Dot<float>((Vector3<float> *)
                         CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                         in_stack_fffffffffffff8d8);
      tVar6 = Dot<float>((Vector3<float> *)
                         CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                         in_stack_fffffffffffff8d8);
      local_1f8 = tVar5 + tVar6;
      auVar57 = (undefined1  [56])0x0;
      VVar59 = Tuple3<pbrt::Vector3,float>::operator-
                         ((Tuple3<pbrt::Vector3,_float> *)
                          CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                          (Vector3<float> *)
                          CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
      local_220 = VVar59.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar25._0_8_ = VVar59.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar25._8_56_ = auVar57;
      local_228 = vmovlpd_avx(auVar25._0_16_);
      local_218 = local_228;
      local_210 = local_220;
      Dot<float>((Vector3<float> *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                 in_stack_fffffffffffff8d8);
      auVar57 = extraout_var_00;
      NVar58 = pbrt::operator*(fVar10,(Tuple3<pbrt::Normal3,_float> *)
                                      CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8))
      ;
      local_268 = NVar58.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar26._0_8_ = NVar58.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar26._8_56_ = auVar57;
      local_270 = vmovlpd_avx(auVar26._0_16_);
      auVar57 = (undefined1  [56])0x0;
      local_260 = local_270;
      local_258 = local_268;
      NVar58 = pbrt::operator*(fVar10,(Tuple3<pbrt::Normal3,_float> *)
                                      CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8))
      ;
      local_288 = NVar58.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar27._0_8_ = NVar58.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar27._8_56_ = auVar57;
      local_290 = vmovlpd_avx(auVar27._0_16_);
      local_280 = local_290;
      local_278 = local_288;
      NVar58 = Tuple3<pbrt::Normal3,float>::operator+
                         ((Tuple3<pbrt::Normal3,_float> *)
                          CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                          (Normal3<float> *)
                          CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
      local_298 = NVar58.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar28._0_8_ = NVar58.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar28._8_56_ = auVar57;
      local_2a0 = vmovlpd_avx(auVar28._0_16_);
      local_250 = local_2a0;
      local_248 = local_298;
      Vector3<float>::Vector3<float>
                ((Vector3<float> *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                 in_stack_fffffffffffff8d8);
      auVar57 = (undefined1  [56])0x0;
      VVar59 = pbrt::operator*(fVar10,(Tuple3<pbrt::Vector3,_float> *)
                                      CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8))
      ;
      local_2a8 = VVar59.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar29._0_8_ = VVar59.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar29._8_56_ = auVar57;
      local_2b0 = vmovlpd_avx(auVar29._0_16_);
      local_238 = local_2b0;
      local_230 = local_2a8;
      VVar59 = Tuple3<pbrt::Vector3,float>::operator+
                         ((Tuple3<pbrt::Vector3,_float> *)
                          CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                          (Vector3<float> *)
                          CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
      local_2b8 = VVar59.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar30._0_8_ = VVar59.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar30._8_56_ = auVar57;
      local_2c0 = vmovlpd_avx(auVar30._0_16_);
      (in_RDI->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z = local_2b8;
      (in_RDI->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)local_2c0;
      (in_RDI->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)local_2c0 >> 0x20);
      local_208 = local_2c0;
      local_200 = local_2b8;
      VVar59 = Tuple3<pbrt::Vector3,float>::operator-
                         ((Tuple3<pbrt::Vector3,_float> *)
                          CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                          (Vector3<float> *)
                          CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
      local_2e0 = VVar59.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar31._0_8_ = VVar59.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar31._8_56_ = auVar57;
      local_2e8 = vmovlpd_avx(auVar31._0_16_);
      local_2d8 = local_2e8;
      local_2d0 = local_2e0;
      Dot<float>((Vector3<float> *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                 in_stack_fffffffffffff8d8);
      auVar57 = extraout_var_01;
      NVar58 = pbrt::operator*(fVar10,(Tuple3<pbrt::Normal3,_float> *)
                                      CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8))
      ;
      local_328 = NVar58.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar32._0_8_ = NVar58.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar32._8_56_ = auVar57;
      local_330 = vmovlpd_avx(auVar32._0_16_);
      auVar57 = (undefined1  [56])0x0;
      local_320 = local_330;
      local_318 = local_328;
      NVar58 = pbrt::operator*(fVar10,(Tuple3<pbrt::Normal3,_float> *)
                                      CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8))
      ;
      local_348 = NVar58.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar33._0_8_ = NVar58.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar33._8_56_ = auVar57;
      local_350 = vmovlpd_avx(auVar33._0_16_);
      local_340 = local_350;
      local_338 = local_348;
      NVar58 = Tuple3<pbrt::Normal3,float>::operator+
                         ((Tuple3<pbrt::Normal3,_float> *)
                          CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                          (Normal3<float> *)
                          CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
      local_358 = NVar58.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar34._0_8_ = NVar58.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar34._8_56_ = auVar57;
      local_360 = vmovlpd_avx(auVar34._0_16_);
      local_310 = local_360;
      local_308 = local_358;
      Vector3<float>::Vector3<float>
                ((Vector3<float> *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                 in_stack_fffffffffffff8d8);
      auVar57 = (undefined1  [56])0x0;
      VVar59 = pbrt::operator*(fVar10,(Tuple3<pbrt::Vector3,_float> *)
                                      CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8))
      ;
      local_368 = VVar59.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar35._0_8_ = VVar59.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar35._8_56_ = auVar57;
      local_370 = vmovlpd_avx(auVar35._0_16_);
      local_2f8 = local_370;
      local_2f0 = local_368;
      VVar59 = Tuple3<pbrt::Vector3,float>::operator+
                         ((Tuple3<pbrt::Vector3,_float> *)
                          CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                          (Vector3<float> *)
                          CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
      local_378 = VVar59.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar36._0_8_ = VVar59.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar36._8_56_ = auVar57;
      local_380 = vmovlpd_avx(auVar36._0_16_);
      (in_RDI->ryDirection).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)local_380;
      (in_RDI->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)local_380 >> 0x20);
      (in_RDI->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z = local_378;
      local_2cc = local_380;
      local_2c4 = local_378;
    }
    else {
      BVar4 = operator|(Transmission,Specular);
      if (local_2c == BVar4) {
        in_RDI->hasDifferentials = true;
        PVar60 = Interaction::p((Interaction *)
                                CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0));
        local_3a8 = PVar60.super_Tuple3<pbrt::Point3,_float>.z;
        auVar37._0_8_ = PVar60.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar37._8_56_ = auVar57;
        local_3b0 = vmovlpd_avx(auVar37._0_16_);
        local_3a0 = local_3b0;
        local_398 = local_3a8;
        PVar61 = Point3<float>::operator+
                           ((Point3<float> *)
                            CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                            (Vector3<float> *)
                            CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
        local_3b8 = PVar61.super_Tuple3<pbrt::Point3,_float>.z;
        auVar38._0_8_ = PVar61.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar38._8_56_ = auVar57;
        local_3c0 = vmovlpd_avx(auVar38._0_16_);
        (in_RDI->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z = local_3b8;
        (in_RDI->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)local_3c0;
        (in_RDI->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y =
             (float)(int)((ulong)local_3c0 >> 0x20);
        local_390 = local_3c0;
        local_388 = local_3b8;
        PVar60 = Interaction::p((Interaction *)
                                CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0));
        local_3e0 = PVar60.super_Tuple3<pbrt::Point3,_float>.z;
        auVar39._0_8_ = PVar60.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar39._8_56_ = auVar57;
        local_3e8 = vmovlpd_avx(auVar39._0_16_);
        local_3d8 = local_3e8;
        local_3d0 = local_3e0;
        PVar61 = Point3<float>::operator+
                           ((Point3<float> *)
                            CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                            (Vector3<float> *)
                            CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
        local_3f0 = PVar61.super_Tuple3<pbrt::Point3,_float>.z;
        auVar40._0_8_ = PVar61.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar40._8_56_ = auVar57;
        local_3f8 = vmovlpd_avx(auVar40._0_16_);
        (in_RDI->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)local_3f8;
        (in_RDI->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y =
             (float)(int)((ulong)local_3f8 >> 0x20);
        (in_RDI->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z = local_3f0;
        local_3fc = 1.0 / *local_20;
        local_3cc = local_3f8;
        local_3c4 = local_3f0;
        tVar5 = Dot<float>((Vector3<float> *)
                           CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                           in_stack_fffffffffffff8d8);
        auVar57 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
        if (tVar5 < 0.0) {
          NVar58 = Tuple3<pbrt::Normal3,_float>::operator-
                             ((Tuple3<pbrt::Normal3,_float> *)
                              CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0));
          local_410 = NVar58.super_Tuple3<pbrt::Normal3,_float>.z;
          auVar41._0_8_ = NVar58.super_Tuple3<pbrt::Normal3,_float>._0_8_;
          auVar41._8_56_ = auVar57;
          local_418 = vmovlpd_avx(auVar41._0_16_);
          local_408 = local_418;
          local_400 = local_410;
          local_38 = local_418;
          local_30 = local_410;
          NVar58 = Tuple3<pbrt::Normal3,_float>::operator-
                             ((Tuple3<pbrt::Normal3,_float> *)
                              CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0));
          local_430 = NVar58.super_Tuple3<pbrt::Normal3,_float>.z;
          auVar42._0_8_ = NVar58.super_Tuple3<pbrt::Normal3,_float>._0_8_;
          auVar42._8_56_ = auVar57;
          local_438 = vmovlpd_avx(auVar42._0_16_);
          local_428 = local_438;
          local_420 = local_430;
          local_48 = local_438;
          local_40 = local_430;
          NVar58 = Tuple3<pbrt::Normal3,_float>::operator-
                             ((Tuple3<pbrt::Normal3,_float> *)
                              CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0));
          local_450 = NVar58.super_Tuple3<pbrt::Normal3,_float>.z;
          auVar43._0_8_ = NVar58.super_Tuple3<pbrt::Normal3,_float>._0_8_;
          auVar43._8_56_ = auVar57;
          local_458 = vmovlpd_avx(auVar43._0_16_);
          local_444 = local_458;
          local_43c = local_450;
          local_a8 = local_458;
          local_a0 = local_450;
        }
        tVar5 = Dot<float>((Vector3<float> *)
                           CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                           in_stack_fffffffffffff8d8);
        s = (float)((ulong)(in_RSI + 0x1c) >> 0x20);
        tVar6 = Dot<float>((Vector3<float> *)
                           CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                           in_stack_fffffffffffff8d8);
        local_45c = tVar5 + tVar6;
        tVar6 = Dot<float>((Vector3<float> *)
                           CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                           in_stack_fffffffffffff8d8);
        tVar7 = Dot<float>((Vector3<float> *)
                           CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                           in_stack_fffffffffffff8d8);
        local_460 = tVar6 + tVar7;
        fVar63 = local_3fc;
        tVar7 = Dot<float>((Vector3<float> *)
                           CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                           in_stack_fffffffffffff8d8);
        auVar44._0_4_ =
             AbsDot<float>((Vector3<float> *)
                           CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                           in_stack_fffffffffffff8d8);
        fVar1 = local_3fc;
        auVar44._4_60_ = extraout_var;
        auVar2 = vfmsub213ss_fma(ZEXT416((uint)tVar7),ZEXT416((uint)fVar63),auVar44._0_16_);
        local_464 = auVar2._0_4_;
        fVar10 = local_3fc * local_3fc;
        tVar8 = Dot<float>((Vector3<float> *)
                           CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                           in_stack_fffffffffffff8d8);
        fVar64 = fVar10 * tVar8;
        tVar8 = AbsDot<float>((Vector3<float> *)
                              CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                              in_stack_fffffffffffff8d8);
        local_468 = (fVar1 - fVar64 / tVar8) * local_45c;
        fVar1 = local_3fc * local_3fc;
        fVar65 = local_3fc;
        tVar8 = Dot<float>((Vector3<float> *)
                           CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                           in_stack_fffffffffffff8d8);
        tVar9 = AbsDot<float>((Vector3<float> *)
                              CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                              in_stack_fffffffffffff8d8);
        local_46c = (fVar65 - (fVar1 * tVar8) / tVar9) * local_460;
        auVar57 = (undefined1  [56])0x0;
        VVar59 = pbrt::operator*(s,(Tuple3<pbrt::Vector3,_float> *)CONCAT44(fVar64,fVar10));
        local_4a0 = VVar59.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar45._0_8_ = VVar59.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar45._8_56_ = auVar57;
        local_4a8 = vmovlpd_avx(auVar45._0_16_);
        local_498 = local_4a8;
        local_490 = local_4a0;
        VVar59 = Tuple3<pbrt::Vector3,float>::operator-
                           ((Tuple3<pbrt::Vector3,_float> *)CONCAT44(tVar7,fVar63),
                            (Vector3<float> *)CONCAT44(tVar6,tVar5));
        local_4b0 = VVar59.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar46._0_8_ = VVar59.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar46._8_56_ = auVar57;
        local_4b8 = vmovlpd_avx(auVar46._0_16_);
        auVar57 = (undefined1  [56])0x0;
        local_488 = local_4b8;
        local_480 = local_4b0;
        NVar58 = pbrt::operator*(s,(Tuple3<pbrt::Normal3,_float> *)CONCAT44(fVar64,fVar10));
        local_4e8 = NVar58.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar47._0_8_ = NVar58.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar47._8_56_ = auVar57;
        local_4f0 = vmovlpd_avx(auVar47._0_16_);
        auVar57 = (undefined1  [56])0x0;
        local_4e0 = local_4f0;
        local_4d8 = local_4e8;
        NVar58 = pbrt::operator*(s,(Tuple3<pbrt::Normal3,_float> *)CONCAT44(fVar64,fVar10));
        local_508 = NVar58.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar48._0_8_ = NVar58.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar48._8_56_ = auVar57;
        local_510 = vmovlpd_avx(auVar48._0_16_);
        local_500 = local_510;
        local_4f8 = local_508;
        NVar58 = Tuple3<pbrt::Normal3,float>::operator+
                           ((Tuple3<pbrt::Normal3,_float> *)CONCAT44(tVar7,fVar63),
                            (Normal3<float> *)CONCAT44(tVar6,tVar5));
        local_518 = NVar58.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar49._0_8_ = NVar58.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar49._8_56_ = auVar57;
        local_520 = vmovlpd_avx(auVar49._0_16_);
        local_4d0 = local_520;
        local_4c8 = local_518;
        Vector3<float>::Vector3<float>
                  ((Vector3<float> *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                   in_stack_fffffffffffff8d8);
        VVar59 = Tuple3<pbrt::Vector3,float>::operator+
                           ((Tuple3<pbrt::Vector3,_float> *)CONCAT44(tVar7,fVar63),
                            (Vector3<float> *)CONCAT44(tVar6,tVar5));
        local_528 = VVar59.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar50._0_8_ = VVar59.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar50._8_56_ = auVar57;
        local_530 = vmovlpd_avx(auVar50._0_16_);
        (in_RDI->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z = local_528;
        (in_RDI->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)local_530;
        (in_RDI->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)local_530 >> 0x20);
        auVar57 = (undefined1  [56])0x0;
        local_478 = local_530;
        local_470 = local_528;
        VVar59 = pbrt::operator*(s,(Tuple3<pbrt::Vector3,_float> *)CONCAT44(fVar64,fVar10));
        local_560 = VVar59.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar51._0_8_ = VVar59.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar51._8_56_ = auVar57;
        local_568 = vmovlpd_avx(auVar51._0_16_);
        local_558 = local_568;
        local_550 = local_560;
        VVar59 = Tuple3<pbrt::Vector3,float>::operator-
                           ((Tuple3<pbrt::Vector3,_float> *)CONCAT44(tVar7,fVar63),
                            (Vector3<float> *)CONCAT44(tVar6,tVar5));
        local_570 = VVar59.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar52._0_8_ = VVar59.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar52._8_56_ = auVar57;
        local_578 = vmovlpd_avx(auVar52._0_16_);
        auVar57 = (undefined1  [56])0x0;
        local_548 = local_578;
        local_540 = local_570;
        NVar58 = pbrt::operator*(s,(Tuple3<pbrt::Normal3,_float> *)CONCAT44(fVar64,fVar10));
        local_5a8 = NVar58.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar53._0_8_ = NVar58.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar53._8_56_ = auVar57;
        local_5b0 = vmovlpd_avx(auVar53._0_16_);
        auVar57 = (undefined1  [56])0x0;
        local_5a0 = local_5b0;
        local_598 = local_5a8;
        NVar58 = pbrt::operator*(s,(Tuple3<pbrt::Normal3,_float> *)CONCAT44(fVar64,fVar10));
        local_5c8 = NVar58.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar54._0_8_ = NVar58.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar54._8_56_ = auVar57;
        local_5d0 = vmovlpd_avx(auVar54._0_16_);
        local_5c0 = local_5d0;
        local_5b8 = local_5c8;
        NVar58 = Tuple3<pbrt::Normal3,float>::operator+
                           ((Tuple3<pbrt::Normal3,_float> *)CONCAT44(tVar7,fVar63),
                            (Normal3<float> *)CONCAT44(tVar6,tVar5));
        local_5d8 = NVar58.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar55._0_8_ = NVar58.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar55._8_56_ = auVar57;
        local_5e0 = vmovlpd_avx(auVar55._0_16_);
        local_590 = local_5e0;
        local_588 = local_5d8;
        Vector3<float>::Vector3<float>
                  ((Vector3<float> *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                   in_stack_fffffffffffff8d8);
        VVar59 = Tuple3<pbrt::Vector3,float>::operator+
                           ((Tuple3<pbrt::Vector3,_float> *)CONCAT44(tVar7,fVar63),
                            (Vector3<float> *)CONCAT44(tVar6,tVar5));
        local_5e8 = VVar59.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar56._0_8_ = VVar59.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar56._8_56_ = auVar57;
        local_5f0 = vmovlpd_avx(auVar56._0_16_);
        (in_RDI->ryDirection).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)local_5f0;
        (in_RDI->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)local_5f0 >> 0x20);
        (in_RDI->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z = local_5e8;
        local_53c = local_5f0;
        local_534 = local_5e8;
      }
    }
  }
  fVar10 = LengthSquared<float>(&in_RDI->rxDirection);
  bVar62 = true;
  if (fVar10 <= 1e+16) {
    fVar10 = LengthSquared<float>(&in_RDI->ryDirection);
    bVar62 = true;
    if (fVar10 <= 1e+16) {
      Vector3<float>::Vector3<float>
                ((Vector3<float> *)CONCAT17(1,in_stack_fffffffffffff8e0),
                 (Point3<float> *)in_stack_fffffffffffff8d8);
      fVar10 = LengthSquared<float>(&local_5fc);
      bVar62 = true;
      if (fVar10 <= 1e+16) {
        Vector3<float>::Vector3<float>
                  ((Vector3<float> *)CONCAT17(1,in_stack_fffffffffffff8e0),
                   (Point3<float> *)in_stack_fffffffffffff8d8);
        fVar10 = LengthSquared<float>(&local_608);
        bVar62 = 1e+16 < fVar10;
      }
    }
  }
  if (bVar62) {
    in_RDI->hasDifferentials = false;
  }
  return in_RDI;
}

Assistant:

RayDifferential SurfaceInteraction::SpawnRay(const RayDifferential &rayi,
                                             const BSDF &bsdf, const Vector3f &wi,
                                             BxDFFlags flags) const {
    RayDifferential rd(SpawnRay(wi));
    if (rayi.hasDifferentials) {
        // Compute ray differentials for specular reflection or transmission
        // Compute common factors for specular ray differentials
        Normal3f ns = shading.n;
        Normal3f dndx = shading.dndu * dudx + shading.dndv * dvdx;
        Normal3f dndy = shading.dndu * dudy + shading.dndv * dvdy;
        Vector3f dwodx = -rayi.rxDirection - wo, dwody = -rayi.ryDirection - wo;

        if (flags == (BxDFFlags::Reflection | BxDFFlags::Specular)) {
            // Initialize origins of specular differential rays
            rd.hasDifferentials = true;
            rd.rxOrigin = p() + dpdx;
            rd.ryOrigin = p() + dpdy;

            // Compute differential reflected directions
            Float dDNdx = Dot(dwodx, ns) + Dot(wo, dndx);
            Float dDNdy = Dot(dwody, ns) + Dot(wo, dndy);
            rd.rxDirection = wi - dwodx + 2.f * Vector3f(Dot(wo, ns) * dndx + dDNdx * ns);
            rd.ryDirection = wi - dwody + 2.f * Vector3f(Dot(wo, ns) * dndy + dDNdy * ns);

        } else if (flags == (BxDFFlags::Transmission | BxDFFlags::Specular)) {
            // Initialize origins of specular differential rays
            rd.hasDifferentials = true;
            rd.rxOrigin = p() + dpdx;
            rd.ryOrigin = p() + dpdy;

            // Compute differential transmitted directions
            // NOTE: eta coming in is now 1/eta from the derivation below, so
            // there's a 1/ here now...
            Float eta = 1 / bsdf.eta;
            if (Dot(wo, ns) < 0) {
                ns = -ns;
                dndx = -dndx;
                dndy = -dndy;
            }
            Float dDNdx = Dot(dwodx, ns) + Dot(wo, dndx);
            Float dDNdy = Dot(dwody, ns) + Dot(wo, dndy);
            // Compute partial derivatives of $\mu$
            Float mu = eta * Dot(wo, ns) - AbsDot(wi, ns);
            Float dmudx = (eta - (eta * eta * Dot(wo, ns)) / AbsDot(wi, ns)) * dDNdx;
            Float dmudy = (eta - (eta * eta * Dot(wo, ns)) / AbsDot(wi, ns)) * dDNdy;

            rd.rxDirection = wi - eta * dwodx + Vector3f(mu * dndx + dmudx * ns);
            rd.ryDirection = wi - eta * dwody + Vector3f(mu * dndy + dmudy * ns);
        }
    }
    // Squash potentially troublesome differentials
    // After many specuar bounces (e.g. the Transparent Machines scenes),
    // differentials can drift off to have large magnitudes, which ends up
    // leaving a trail of Infs and NaNs in their wake. We'll disable the
    // differentials when this seems to be happening.
    //
    // TODO: this is unsatisfying and would be nice to address in a more
    // principled way.
    if (LengthSquared(rd.rxDirection) > 1e16f || LengthSquared(rd.ryDirection) > 1e16f ||
        LengthSquared(Vector3f(rd.rxOrigin)) > 1e16f ||
        LengthSquared(Vector3f(rd.ryOrigin)) > 1e16f)
        rd.hasDifferentials = false;

    return rd;
}